

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

bool __thiscall FlowGraph::UnsignedCmpPeep(FlowGraph *this,Instr *cmpInstr)

{
  Opnd *src;
  Opnd *src_00;
  bool bVar1;
  OpndKind OVar2;
  OpCode OVar3;
  RegOpnd *pRVar4;
  IntConstOpnd *pIVar5;
  Instr *pIVar6;
  Func *func;
  Opnd *local_48;
  Opnd *newSrc1;
  Opnd *newSrc2;
  
  src = cmpInstr->m_src1;
  src_00 = cmpInstr->m_src2;
  bVar1 = Func::DoGlobOpt(this->func);
  if ((!bVar1) || (bVar1 = GlobOpt::DoAggressiveIntTypeSpec(this->func), !bVar1)) {
    return false;
  }
  func = this->func;
  bVar1 = GlobOpt::DoLossyIntTypeSpec(func);
  if (!bVar1) {
    return false;
  }
  if (cmpInstr->m_kind == InstrKindBranch) {
    OVar3 = cmpInstr->m_opcode;
    if (OVar3 < ADD) {
      bVar1 = OVar3 == MultiBr || OVar3 == Br;
    }
    else {
      func = (Func *)cmpInstr;
      bVar1 = LowererMD::IsUnconditionalBranch(cmpInstr);
    }
    if (bVar1 != false) {
      return false;
    }
  }
  if (cmpInstr->m_src2 == (Opnd *)0x0) {
    return false;
  }
  bVar1 = IsUnsignedOpnd((FlowGraph *)func,src,&local_48);
  if (!bVar1) {
    return false;
  }
  bVar1 = IsUnsignedOpnd((FlowGraph *)func,src_00,&newSrc1);
  if (!bVar1) {
    return false;
  }
  bVar1 = false;
  switch(cmpInstr->m_opcode) {
  case BrEq_A:
  case BrNeq_A:
  case BrSrEq_A:
  case BrSrNeq_A:
    goto switchD_00418b62_caseD_c;
  case BrFalse_A:
  case BrTrue_A:
    goto switchD_00418b62_caseD_e;
  case BrGe_A:
    OVar3 = BrUnGe_A;
    break;
  case BrGt_A:
    OVar3 = BrUnGt_A;
    break;
  case BrLt_A:
    OVar3 = BrUnLt_A;
    break;
  case BrLe_A:
    OVar3 = BrUnLe_A;
    break;
  default:
    switch(cmpInstr->m_opcode) {
    case CmEq_A:
    case CmNeq_A:
    case CmSrEq_A:
    case CmSrNeq_A:
      goto switchD_00418b62_caseD_c;
    case CmGe_A:
      OVar3 = CmUnGe_A;
      break;
    case CmGt_A:
      OVar3 = CmUnGt_A;
      break;
    case CmLt_A:
      OVar3 = CmUnLt_A;
      break;
    case CmLe_A:
      OVar3 = CmUnLe_A;
      break;
    default:
      goto switchD_00418b62_caseD_e;
    }
  }
  cmpInstr->m_opcode = OVar3;
switchD_00418b62_caseD_c:
  newSrc2 = (Opnd *)IR::ByteCodeUsesInstr::New(cmpInstr);
  if (src != local_48) {
    OVar2 = IR::Opnd::GetKind(src);
    if ((OVar2 == OpndKindReg) && ((src->field_0xb & 8) == 0)) {
      IR::ByteCodeUsesInstr::Set((ByteCodeUsesInstr *)newSrc2,src);
    }
    pRVar4 = IR::RegOpnd::New(local_48->m_type,cmpInstr->m_func);
    pIVar5 = IR::IntConstOpnd::New(0,TyInt64,cmpInstr->m_func,false);
    pIVar6 = IR::Instr::New(Or_A,&pRVar4->super_Opnd,local_48,&pIVar5->super_Opnd,cmpInstr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar6,cmpInstr);
    IR::Instr::InsertBefore(cmpInstr,pIVar6);
    IR::Instr::ReplaceSrc1(cmpInstr,&pRVar4->super_Opnd);
    OVar2 = IR::Opnd::GetKind(local_48);
    if (OVar2 == OpndKindReg) {
      pRVar4 = IR::Opnd::AsRegOpnd(cmpInstr->m_src1);
      IR::Opnd::SetIsJITOptimizedReg(&pRVar4->super_Opnd,true);
      IR::Opnd::SetIsJITOptimizedReg(pIVar6->m_src1,true);
    }
  }
  if (src_00 != newSrc1) {
    OVar2 = IR::Opnd::GetKind(src_00);
    if ((OVar2 == OpndKindReg) && ((src_00->field_0xb & 8) == 0)) {
      IR::ByteCodeUsesInstr::Set((ByteCodeUsesInstr *)newSrc2,src_00);
    }
    pRVar4 = IR::RegOpnd::New(newSrc1->m_type,cmpInstr->m_func);
    pIVar5 = IR::IntConstOpnd::New(0,TyInt64,cmpInstr->m_func,false);
    pIVar6 = IR::Instr::New(Or_A,&pRVar4->super_Opnd,newSrc1,&pIVar5->super_Opnd,cmpInstr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar6,cmpInstr);
    IR::Instr::InsertBefore(cmpInstr,pIVar6);
    IR::Instr::ReplaceSrc2(cmpInstr,&pRVar4->super_Opnd);
    OVar2 = IR::Opnd::GetKind(newSrc1);
    if (OVar2 == OpndKindReg) {
      pRVar4 = IR::Opnd::AsRegOpnd(cmpInstr->m_src2);
      IR::Opnd::SetIsJITOptimizedReg(&pRVar4->super_Opnd,true);
      IR::Opnd::SetIsJITOptimizedReg(pIVar6->m_src1,true);
    }
  }
  IR::Instr::InsertBefore(cmpInstr,(Instr *)newSrc2);
  bVar1 = true;
switchD_00418b62_caseD_e:
  return bVar1;
}

Assistant:

bool FlowGraph::UnsignedCmpPeep(IR::Instr *cmpInstr)
{
    IR::Opnd *cmpSrc1 = cmpInstr->GetSrc1();
    IR::Opnd *cmpSrc2 = cmpInstr->GetSrc2();
    IR::Opnd *newSrc1;
    IR::Opnd *newSrc2;

    // Look for something like:
    //  t1 = ShrU_A x, 0
    //  t2 = 10;
    //  BrGt t1, t2, L
    //
    // Peep to:
    //
    //  t1 = ShrU_A x, 0
    //  t2 = 10;
    //  t3 = Or_A x, 0
    //  BrUnGt x, t3, L
    //       ByteCodeUse t1
    //
    // Hopefully dead-store can get rid of the ShrU

    if (!this->func->DoGlobOpt() || !GlobOpt::DoAggressiveIntTypeSpec(this->func) || !GlobOpt::DoLossyIntTypeSpec(this->func))
    {
        return false;
    }

    if (cmpInstr->IsBranchInstr() && !cmpInstr->AsBranchInstr()->IsConditional())
    {
        return false;
    }

    if (!cmpInstr->GetSrc2())
    {
        return false;
    }

    if (!this->IsUnsignedOpnd(cmpSrc1, &newSrc1))
    {
        return false;
    }
    if (!this->IsUnsignedOpnd(cmpSrc2, &newSrc2))
    {
        return false;
    }

    switch(cmpInstr->m_opcode)
    {
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::CmEq_A:
    case Js::OpCode::CmNeq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmSrNeq_A:
        break;
    case Js::OpCode::BrLe_A:
        cmpInstr->m_opcode = Js::OpCode::BrUnLe_A;
        break;
    case Js::OpCode::BrLt_A:
        cmpInstr->m_opcode = Js::OpCode::BrUnLt_A;
        break;
    case Js::OpCode::BrGe_A:
        cmpInstr->m_opcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::BrGt_A:
        cmpInstr->m_opcode = Js::OpCode::BrUnGt_A;
        break;
    case Js::OpCode::CmLe_A:
        cmpInstr->m_opcode = Js::OpCode::CmUnLe_A;
        break;
    case Js::OpCode::CmLt_A:
        cmpInstr->m_opcode = Js::OpCode::CmUnLt_A;
        break;
    case Js::OpCode::CmGe_A:
        cmpInstr->m_opcode = Js::OpCode::CmUnGe_A;
        break;
    case Js::OpCode::CmGt_A:
        cmpInstr->m_opcode = Js::OpCode::CmUnGt_A;
        break;

    default:
        return false;
    }

    IR::ByteCodeUsesInstr * bytecodeInstr = IR::ByteCodeUsesInstr::New(cmpInstr);

    if (cmpSrc1 != newSrc1)
    {
        if (cmpSrc1->IsRegOpnd() && !cmpSrc1->GetIsJITOptimizedReg())
        {
            bytecodeInstr->Set(cmpSrc1);
        }

        IR::RegOpnd * unsignedSrc = IR::RegOpnd::New(newSrc1->GetType(), cmpInstr->m_func);
        IR::Instr * orZero = IR::Instr::New(Js::OpCode::Or_A, unsignedSrc, newSrc1, IR::IntConstOpnd::New(0, TyMachReg, cmpInstr->m_func), cmpInstr->m_func);
        orZero->SetByteCodeOffset(cmpInstr);
        cmpInstr->InsertBefore(orZero);
        cmpInstr->ReplaceSrc1(unsignedSrc);
        if (newSrc1->IsRegOpnd())
        {
            cmpInstr->GetSrc1()->AsRegOpnd()->SetIsJITOptimizedReg(true);
            orZero->GetSrc1()->SetIsJITOptimizedReg(true);
        }
    }
    if (cmpSrc2 != newSrc2)
    {
        if (cmpSrc2->IsRegOpnd() && !cmpSrc2->GetIsJITOptimizedReg())
        {
            bytecodeInstr->Set(cmpSrc2);
        }

        IR::RegOpnd * unsignedSrc = IR::RegOpnd::New(newSrc2->GetType(), cmpInstr->m_func);
        IR::Instr * orZero = IR::Instr::New(Js::OpCode::Or_A, unsignedSrc, newSrc2, IR::IntConstOpnd::New(0, TyMachReg, cmpInstr->m_func), cmpInstr->m_func);
        orZero->SetByteCodeOffset(cmpInstr);
        cmpInstr->InsertBefore(orZero);
        cmpInstr->ReplaceSrc2(unsignedSrc);
        if (newSrc2->IsRegOpnd())
        {
            cmpInstr->GetSrc2()->AsRegOpnd()->SetIsJITOptimizedReg(true);
            orZero->GetSrc1()->SetIsJITOptimizedReg(true);
        }
    }

    cmpInstr->InsertBefore(bytecodeInstr);
    return true;
}